

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

Am_Value_List
list_final_value(Am_Object *inter,Am_Object *new_object,Am_Object *ref_object,
                Am_Value_List *old_value,bool separate_extend)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_List_Item *extraout_RDX;
  undefined7 in_register_00000081;
  Am_Value_List *this;
  byte in_R9B;
  Am_Value_List AVar4;
  int local_7c;
  int local_78;
  int i;
  int stopErase;
  int startErase;
  int stopSet;
  int startSet;
  Am_Object current;
  undefined1 local_50 [8];
  Am_Value_List all_objects;
  Am_Object widget;
  bool separate_extend_local;
  Am_Value_List *old_value_local;
  Am_Object *ref_object_local;
  Am_Object *new_object_local;
  Am_Object *inter_local;
  Am_Value_List *new_value;
  
  this = (Am_Value_List *)CONCAT71(in_register_00000081,separate_extend);
  Am_Object::Get_Owner((Am_Object *)&all_objects.item,(Am_Slot_Flags)new_object);
  pAVar2 = Am_Object::Get((Am_Object *)&all_objects.item,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50,pAVar2);
  current.data._3_1_ = 0;
  Am_Value_List::Am_Value_List((Am_Value_List *)inter);
  Am_Object::Am_Object((Am_Object *)&stopSet);
  calc_ranks(&startErase,&stopErase,&i,&local_78,&Am_No_Object,ref_object,(Am_Object *)old_value);
  Am_Value_List::Start((Am_Value_List *)local_50);
  if (startErase != -1) {
    for (local_7c = 0; local_7c < startErase; local_7c = local_7c + 1) {
      if ((in_R9B & 1) != 0) {
        pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
        Am_Object::operator=((Am_Object *)&stopSet,pAVar2);
        Am_Value_List::Start(this);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stopSet);
        bVar1 = Am_Value_List::Member(this,pAVar3);
        if (bVar1) {
          pAVar2 = Am_Object::Get((Am_Object *)&stopSet,0xcc,0);
          bVar1 = Am_Value::Valid(pAVar2);
          if (bVar1) {
            pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stopSet);
            Am_Value_List::Add((Am_Value_List *)inter,pAVar3,Am_TAIL,true);
          }
        }
      }
      Am_Value_List::Next((Am_Value_List *)local_50);
    }
    for (; local_7c <= stopErase; local_7c = local_7c + 1) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
      Am_Object::operator=((Am_Object *)&stopSet,pAVar2);
      pAVar2 = Am_Object::Get((Am_Object *)&stopSet,0xcc,0);
      bVar1 = Am_Value::Valid(pAVar2);
      if (bVar1) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stopSet);
        Am_Value_List::Add((Am_Value_List *)inter,pAVar3,Am_TAIL,true);
      }
      Am_Value_List::Next((Am_Value_List *)local_50);
    }
  }
  if ((in_R9B & 1) != 0) {
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
      Am_Object::operator=((Am_Object *)&stopSet,pAVar2);
      Am_Value_List::Start(this);
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stopSet);
      bVar1 = Am_Value_List::Member(this,pAVar3);
      if (bVar1) {
        pAVar2 = Am_Object::Get((Am_Object *)&stopSet,0xcc,0);
        bVar1 = Am_Value::Valid(pAVar2);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stopSet);
          Am_Value_List::Add((Am_Value_List *)inter,pAVar3,Am_TAIL,true);
        }
      }
      Am_Value_List::Next((Am_Value_List *)local_50);
    }
  }
  set_selected_from_list(new_object,(Am_Value_List *)local_50,(Am_Value_List *)inter);
  current.data._3_1_ = 1;
  Am_Object::~Am_Object((Am_Object *)&stopSet);
  if ((current.data._3_1_ & 1) == 0) {
    Am_Value_List::~Am_Value_List((Am_Value_List *)inter);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Object::~Am_Object((Am_Object *)&all_objects.item);
  AVar4.item = extraout_RDX;
  AVar4.data = (Am_Value_List_Data *)inter;
  return AVar4;
}

Assistant:

Am_Value_List
list_final_value(Am_Object &inter, Am_Object &new_object, Am_Object &ref_object,
                 Am_Value_List &old_value, bool separate_extend)
{
  Am_Object widget = inter.Get_Owner();
  Am_Value_List all_objects = widget.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_value;
  Am_Object current;

  int startSet, stopSet, startErase, stopErase;
  calc_ranks(startSet, stopSet, startErase, stopErase, Am_No_Object, new_object,
             ref_object);
  all_objects.Start();
  if (startSet != -1) {
    int i;
    for (i = 0; i < startSet; all_objects.Next(), i++) {
      if (separate_extend) { //otherwise, just ignore these
        current = all_objects.Get();
        old_value.Start();
        if (old_value.Member(current)) {
          if (current.Get(Am_ACTIVE).Valid())
            new_value.Add(current);
        }
      }
    }
    for (; i <= stopSet; all_objects.Next(), i++) {
      current = all_objects.Get();
      if (current.Get(Am_ACTIVE).Valid())
        new_value.Add(current);
    }
  }
  if (separate_extend) { //process the rest of the list
    //start from current position in the list
    for (; !all_objects.Last(); all_objects.Next()) {
      current = all_objects.Get();
      old_value.Start();
      if (old_value.Member(current))
        if (current.Get(Am_ACTIVE).Valid())
          new_value.Add(current);
    }
  }
  //now new_value has the final value
  set_selected_from_list(inter, all_objects, new_value);
  return new_value;
}